

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O3

void hashlin_shrink_step(tommy_hashlin *hashlin)

{
  long lVar1;
  tommy_hashlin_node *ptVar2;
  long lVar3;
  tommy_count_t tVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  tommy_node_struct *ptVar12;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = hashlin->count;
  if (hashlin->state != 2) {
    if ((hashlin->bucket_max >> 3 <= uVar6) || (hashlin->bucket_bit < 7)) goto LAB_00110e25;
    if (hashlin->state == 0) {
      uVar7 = hashlin->bucket_max >> 1;
      hashlin->low_max = uVar7;
      hashlin->low_mask = hashlin->bucket_mask >> 1;
      hashlin->split = uVar7;
    }
    hashlin->state = 2;
  }
  uVar10 = (ulong)(hashlin->low_max + hashlin->split);
  uVar8 = (ulong)(hashlin->split - 1);
  lVar11 = uVar8 * 8;
  do {
    if ((uint)uVar10 <= uVar6 << 3) goto LAB_00110e25;
    uVar5 = (uint)uVar8;
    hashlin->split = uVar5;
    uVar9 = (uint)uVar10 - 1;
    uVar10 = (ulong)uVar9;
    uVar9 = uVar9 | 1;
    uVar7 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    ptVar2 = hashlin->bucket[uVar7][uVar10];
    if (ptVar2 != (tommy_hashlin_node *)0x0) {
      uVar7 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      lVar3 = *(long *)((long)hashlin->bucket[uVar7] + lVar11);
      if (lVar3 == 0) {
        ptVar12 = (tommy_node_struct *)((long)hashlin->bucket[uVar7] + lVar11);
      }
      else {
        ptVar12 = *(tommy_node_struct **)(lVar3 + 8);
        *(tommy_node_struct **)(lVar3 + 8) = ptVar2->prev;
        ptVar2->prev = ptVar12;
      }
      ptVar12->next = ptVar2;
    }
    lVar11 = lVar11 + -8;
    uVar8 = (ulong)(uVar5 - 1);
  } while (uVar5 != 0);
  uVar6 = hashlin->bucket_bit - 1;
  tVar4 = 1 << ((byte)uVar6 & 0x1f);
  hashlin->bucket_bit = uVar6;
  hashlin->bucket_max = tVar4;
  hashlin->bucket_mask = tVar4 - 1;
  lrtr_free(hashlin->bucket[uVar6] + (1L << ((byte)uVar6 & 0x3f)));
  hashlin->state = 0;
  hashlin->low_max = hashlin->bucket_max;
  hashlin->low_mask = hashlin->bucket_mask;
  hashlin->split = 0;
LAB_00110e25:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void hashlin_shrink_step(tommy_hashlin* hashlin)
{
	/* shrink if less than 12.5% full */
	if (hashlin->state != TOMMY_HASHLIN_STATE_SHRINK
		&& hashlin->count < hashlin->bucket_max / 8
	) {
		/* avoid to shrink the first bucket */
		if (hashlin->bucket_bit > TOMMY_HASHLIN_BIT) {
			/* if we are stable, setup a new shrink state */
			/* otherwise continue with the already setup grow one */
			/* but in backward direction */
			if (hashlin->state == TOMMY_HASHLIN_STATE_STABLE) {
				/* set the lower size */
				hashlin->low_max = hashlin->bucket_max / 2;
				hashlin->low_mask = hashlin->bucket_mask / 2;

				/* start from the half going backward */
				hashlin->split = hashlin->low_max;
			}

			/* start reallocation */
			hashlin->state = TOMMY_HASHLIN_STATE_SHRINK;
		}
	}

	/* if we are shrinking */
	if (hashlin->state == TOMMY_HASHLIN_STATE_SHRINK) {
		/* compute the split target required to finish the reallocation before the next resize */
		tommy_count_t split_target = 8 * hashlin->count;

		/* reallocate buckets until the split target */
		while (hashlin->split + hashlin->low_max > split_target) {
			tommy_hashlin_node** split[2];

			/* go backward position */
			--hashlin->split;

			/* get the low bucket */
			split[0] = tommy_hashlin_pos(hashlin, hashlin->split);

			/* get the high bucket */
			split[1] = tommy_hashlin_pos(hashlin, hashlin->split + hashlin->low_max);

			/* concat the high bucket into the low one */
			tommy_list_concat(split[0], split[1]);

			/* if we have finished, clean up and change the state */
			if (hashlin->split == 0) {
				tommy_hashlin_node** segment;

				/* shrink the hash size */
				--hashlin->bucket_bit;
				hashlin->bucket_max = 1 << hashlin->bucket_bit;
				hashlin->bucket_mask = hashlin->bucket_max - 1;

				/* free the last segment */
				segment = hashlin->bucket[hashlin->bucket_bit];
				tommy_free(&segment[((tommy_ptrdiff_t)1) << hashlin->bucket_bit]);

				/* go in stable mode */
				tommy_hashlin_stable(hashlin);
				break;
			}
		}
	}
}